

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderTeambalanceWarning(CHud *this)

{
  int iVar1;
  CConfig *pCVar2;
  CTextCursor *this_00;
  int64 iVar3;
  char *pcVar4;
  ITextRender *pIVar5;
  char *in_RDI;
  char *pText;
  bool Flash;
  int64 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe8;
  uint uVar6;
  float in_stack_ffffffffffffffec;
  CTextCursor *in_stack_fffffffffffffff0;
  
  if (((((*(uint *)(*(long *)(in_RDI + 8) + 0x1b15c) & 1) != 0) &&
       (pCVar2 = CComponent::Config((CComponent *)0x1672d7), pCVar2->m_ClWarningTeambalance != 0))
      && ((*(byte *)(*(long *)(in_RDI + 8) + 0x1b186) & 1) != 0)) &&
     (iVar1 = absolute<int>(*(int *)(*(long *)(in_RDI + 8) + 0x1b174) -
                            *(int *)(*(long *)(in_RDI + 8) + 0x1b178)), 1 < iVar1)) {
    if ((RenderTeambalanceWarning()::s_Cursor == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderTeambalanceWarning()::s_Cursor), iVar1 != 0)) {
      CTextCursor::CTextCursor
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                 (float)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderTeambalanceWarning::s_Cursor,&__dso_handle);
      __cxa_guard_release(&RenderTeambalanceWarning()::s_Cursor);
    }
    this_00 = (CTextCursor *)time_get();
    iVar3 = time_freq();
    uVar6 = (uint)(((long)this_00 / (iVar3 / 2)) % 2 == 0) << 0x18;
    pcVar4 = Localize(in_stack_ffffffffffffffe0,in_RDI);
    if ((uVar6 & 0x1000000) == 0) {
      pIVar5 = CComponent::TextRender((CComponent *)0x16743a);
      (*(pIVar5->super_IInterface)._vptr_IInterface[4])(0x3f333333,0x3f333333,0x3e4ccccd,0x3f800000)
      ;
    }
    else {
      pIVar5 = CComponent::TextRender((CComponent *)0x1673ec);
      (*(pIVar5->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f000000);
    }
    CLocalizationDatabase::Version(&g_Localization);
    CTextCursor::Reset(this_00,in_stack_ffffffffffffffc8);
    pIVar5 = CComponent::TextRender((CComponent *)0x16749a);
    (*(pIVar5->super_IInterface)._vptr_IInterface[0xb])
              (pIVar5,&RenderTeambalanceWarning::s_Cursor,pcVar4,0xffffffff);
    pIVar5 = CComponent::TextRender((CComponent *)0x1674be);
    (*(pIVar5->super_IInterface)._vptr_IInterface[4])(0x3f800000,0x3f800000,0x3f800000);
  }
  return;
}

Assistant:

void CHud::RenderTeambalanceWarning()
{
	// render prompt about team-balance
	if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS && Config()->m_ClWarningTeambalance && m_pClient->m_ServerSettings.m_TeamBalance &&
		absolute(m_pClient->m_GameInfo.m_aTeamSize[TEAM_RED]-m_pClient->m_GameInfo.m_aTeamSize[TEAM_BLUE]) >= NUM_TEAMS)
	{
		static CTextCursor s_Cursor(6.0f, 5.0f, 50.0f);

		bool Flash = time_get()/(time_freq()/2)%2 == 0;
		const char *pText = Localize("Please balance teams!");
		if(Flash)
			TextRender()->TextColor(1,1,0.5f,1);
		else
			TextRender()->TextColor(0.7f,0.7f,0.2f,1.0f);
		
		s_Cursor.Reset(g_Localization.Version() << 1 | (Flash ? 1 : 0));
		TextRender()->TextOutlined(&s_Cursor, pText, -1);
		TextRender()->TextColor(1,1,1,1);
	}
}